

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testScanLineApi.cpp
# Opt level: O0

void anon_unknown.dwarf_21e8e4::fillPixels
               (Array2D<unsigned_int> *pi,Array2D<Imath_3_2::half> *ph,Array2D<float> *pf,int width,
               int height)

{
  uint *puVar1;
  float *pfVar2;
  int in_ECX;
  int iVar3;
  uint uVar4;
  Array2D<float> *in_RDX;
  Array2D<Imath_3_2::half> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  int in_R8D;
  double dVar5;
  double dVar6;
  int x;
  int y;
  float in_stack_ffffffffffffffac;
  int local_28;
  int local_24;
  
  for (local_24 = 0; local_24 < in_R8D; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < in_ECX; local_28 = local_28 + 1) {
      iVar3 = local_28 % 100;
      uVar4 = iVar3 + (local_24 % 100) * 100;
      puVar1 = Imf_3_4::Array2D<unsigned_int>::operator[](in_RDI,(long)local_24);
      puVar1[local_28] = uVar4;
      sin((double)local_28);
      sin((double)local_24 * 0.5);
      Imf_3_4::Array2D<Imath_3_2::half>::operator[](in_RSI,(long)local_24);
      Imath_3_2::half::operator=((half *)CONCAT44(uVar4,iVar3),in_stack_ffffffffffffffac);
      dVar5 = sin((double)local_24);
      dVar6 = sin((double)local_28 * 0.5);
      pfVar2 = Imf_3_4::Array2D<float>::operator[](in_RDX,(long)local_24);
      pfVar2[local_28] = (float)(dVar5 + dVar6);
    }
  }
  return;
}

Assistant:

void
fillPixels (
    Array2D<unsigned int>& pi,
    Array2D<half>&         ph,
    Array2D<float>&        pf,
    int                    width,
    int                    height)
{
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            pi[y][x] = x % 100 + 100 * (y % 100);
            ph[y][x] = sin (double (x)) + sin (y * 0.5);
            pf[y][x] = sin (double (y)) + sin (x * 0.5);
        }
}